

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigfile.c
# Opt level: O2

int big_block_write(BigBlock *bb,BigBlockPtr *ptr,BigArray *array)

{
  byte bVar1;
  size_t sVar2;
  int iVar3;
  byte *buf;
  ulong uVar4;
  ulong uVar5;
  FILE *__stream;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  ulong __size;
  long lVar9;
  ulong __n;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  byte *pbVar13;
  char *msg;
  bool bVar14;
  size_t dims [2];
  BigArrayIter array_iter;
  BigArray chunk_array;
  BigArrayIter chunk_iter;
  
  if (array->size == 0) {
    return 0;
  }
  bb->dirty = 1;
  sVar2 = CHUNK_BYTES;
  buf = (byte *)malloc(CHUNK_BYTES);
  uVar12 = bb->nmemb;
  dims[1] = (size_t)(int)uVar12;
  uVar11 = 1;
  if (1 < uVar12) {
    uVar11 = uVar12;
  }
  iVar3 = big_file_dtype_itemsize(bb->dtype);
  __size = (ulong)(int)(iVar3 * uVar11);
  uVar4 = sVar2 / __size;
  memset(&chunk_array,0,0x220);
  dims[0] = uVar4;
  if (buf == (byte *)0x0) {
    _big_file_raise("not enough memory for chunkbuf of size %d bytes",
                    "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                    ,0x391,sVar2);
  }
  else {
    big_array_init(&chunk_array,buf,bb->dtype,2,dims,(ptrdiff_t *)0x0);
    big_array_iter_init(&array_iter,array);
    uVar5 = array->size / (ulong)(long)(int)uVar11;
    if (bb->size < bb->foffset[ptr->fileid] + uVar5 + ptr->roffset) {
      _big_file_raise("Writing beyond the block `%s` at (%d:%td)",
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,0x39c,bb->basename,(long)ptr->fileid,ptr->roffset * __size);
    }
    else {
      do {
        if ((long)uVar5 < 1) {
LAB_00109b63:
          free(buf);
          return 0;
        }
        if (bb->size <= bb->foffset[ptr->fileid] + ptr->roffset) goto LAB_00109b63;
        __n = bb->fsize[ptr->fileid] - ptr->roffset;
        if (uVar4 < __n) {
          __n = uVar4;
        }
        if (uVar5 <= __n) {
          __n = uVar5;
        }
        big_array_iter_init(&chunk_iter,&chunk_array);
        iVar3 = _dtype_convert(&chunk_iter,&array_iter,(long)bb->nmemb * __n);
        if (iVar3 != 0) {
          iVar3 = 0x3ad;
          goto LAB_00109b92;
        }
        lVar9 = __n * __size;
        uVar12 = bb->fchecksum[ptr->fileid];
        pbVar13 = buf;
        while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
          bVar1 = *pbVar13;
          pbVar13 = pbVar13 + 1;
          uVar12 = uVar12 + bVar1;
        }
        bb->fchecksum[ptr->fileid] = uVar12;
        __stream = (FILE *)_big_file_open_a_file(bb->basename,ptr->fileid,"r+",1);
        if (__stream == (FILE *)0x0) {
          iVar3 = 0x3b4;
          goto LAB_00109b92;
        }
        iVar3 = fseek(__stream,ptr->roffset * __size,0);
        if (iVar3 < 0) {
          pcVar10 = bb->basename;
          uVar12 = ptr->fileid;
          lVar9 = ptr->roffset;
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          msg = "Failed to seek in block `%s\' at (%d:%td) (%s)";
          iVar3 = 0x3b8;
LAB_00109c02:
          _big_file_raise(msg,
                          "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                          ,iVar3,pcVar10,(ulong)uVar12,__size * lVar9,pcVar8);
          fclose(__stream);
          goto LAB_00109c1a;
        }
        sVar6 = fwrite(buf,__size,__n,__stream);
        if (__n != sVar6) {
          pcVar10 = bb->basename;
          uVar12 = ptr->fileid;
          lVar9 = ptr->roffset;
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          msg = "Failed to write in block `%s\' at (%d:%td) (%s)";
          iVar3 = 0x3bc;
          goto LAB_00109c02;
        }
        fclose(__stream);
        uVar5 = uVar5 - __n;
        iVar3 = big_block_seek_rel(bb,ptr,__n);
      } while (iVar3 == 0);
      iVar3 = 0x3c1;
LAB_00109b92:
      _big_file_raise((char *)0x0,
                      "/workspace/llm4binary/github/license_c_cmakelists/rainwoodman[P]bigfile/src/bigfile.c"
                      ,iVar3);
    }
LAB_00109c1a:
    free(buf);
  }
  return -1;
}

Assistant:

int
big_block_write(BigBlock * bb, BigBlockPtr * ptr, BigArray * array)
{
    if(array->size == 0) return 0;
    /* the file header is modified */
    bb->dirty = 1;
    char * chunkbuf = malloc(CHUNK_BYTES);
    int nmemb = bb->nmemb ? bb->nmemb : 1;
    int felsize = big_file_dtype_itemsize(bb->dtype) * nmemb;
    size_t CHUNK_SIZE = CHUNK_BYTES / felsize;

    BigArray chunk_array = {0};
    size_t dims[2];
    dims[0] = CHUNK_SIZE;
    dims[1] = bb->nmemb;

    BigArrayIter chunk_iter;
    BigArrayIter array_iter;
    ptrdiff_t towrite = 0;
    FILE * fp;

    RAISEIF(chunkbuf == NULL,
            ex_malloc,
            "not enough memory for chunkbuf of size %d bytes", CHUNK_BYTES);

    big_array_init(&chunk_array, chunkbuf, bb->dtype, 2, dims, NULL);
    big_array_iter_init(&array_iter, array);

    towrite = array->size / nmemb;

    ptrdiff_t abs = bb->foffset[ptr->fileid] + ptr->roffset + towrite;
    RAISEIF(abs > bb->size,
                ex_eof,
                "Writing beyond the block `%s` at (%d:%td)",
                bb->basename, ptr->fileid, ptr->roffset * felsize);

    while(towrite > 0 && ! big_block_eof(bb, ptr)) {
        size_t chunk_size = CHUNK_SIZE;
        /* remaining items in the file */
        if(chunk_size > bb->fsize[ptr->fileid] - ptr->roffset) {
            chunk_size = bb->fsize[ptr->fileid] - ptr->roffset;
        }
        /* remaining items to read */
        if(chunk_size > towrite) {
            chunk_size = towrite;
        }
        /* write from the beginning of chunk */
        big_array_iter_init(&chunk_iter, &chunk_array);

        /* now translate the data to format in the file*/
        RAISEIF(0 != _dtype_convert(&chunk_iter, &array_iter, chunk_size * bb->nmemb),
            ex_convert, NULL);

        sysvsum(&bb->fchecksum[ptr->fileid], chunkbuf, chunk_size * felsize);

        fp = _big_file_open_a_file(bb->basename, ptr->fileid, "r+", 1);
        RAISEIF(fp == NULL,
                ex_open,
                NULL);
        RAISEIF(0 > fseek(fp, ptr->roffset * felsize, SEEK_SET),
                ex_seek,
                "Failed to seek in block `%s' at (%d:%td) (%s)", 
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        RAISEIF(chunk_size != fwrite(chunkbuf, felsize, chunk_size, fp),
                ex_write,
                "Failed to write in block `%s' at (%d:%td) (%s)",
                bb->basename, ptr->fileid, ptr->roffset * felsize, strerror(errno));
        fclose(fp);

        towrite -= chunk_size;
        RAISEIF(0 != big_block_seek_rel(bb, ptr, chunk_size),
                ex_blockseek, NULL);
    }
    free(chunkbuf);
    return 0;
ex_write:
ex_seek:
    fclose(fp);
ex_convert:
ex_open:
ex_blockseek:
ex_eof:
    free(chunkbuf);
ex_malloc:
    return -1;
}